

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

unsigned_long CalculateBlockCRC32(unsigned_long ulCount,uchar *ucBuffer)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  
  uVar2 = 0;
  for (uVar3 = 0; ulCount != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = CRC32Value((uint)(byte)((byte)uVar2 ^ ucBuffer[uVar3]));
    uVar2 = uVar1 ^ uVar2 >> 8 & 0xffffff;
  }
  return uVar2;
}

Assistant:

unsigned long CalculateBlockCRC32( unsigned long ulCount, unsigned char* ucBuffer )
{
    unsigned long ulTemp1;
    unsigned long ulTemp2;
    unsigned long ulCRC = 0;
    while ( ulCount-- != 0 )
    {
        ulTemp1 = ( ulCRC >> 8 ) & 0x00FFFFFFL;
        ulTemp2 = CRC32Value( ((int) ulCRC ^ *ucBuffer++ ) & 0xFF );
        ulCRC = ulTemp1 ^ ulTemp2;
    }
    return( ulCRC );
}